

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Digit.hpp
# Opt level: O0

void Qentem::Digit::powerOfNegativeTen<unsigned_long_long>
               (unsigned_long_long *number,SizeT32 exponent)

{
  SizeT32 SVar1;
  uint uVar2;
  SizeT64 SVar3;
  unsigned_long_long uVar4;
  uint local_4c;
  SizeT32 bit;
  SizeT32 exp;
  undefined1 local_40 [3];
  bool is_size_8;
  SizeT32 shifted;
  BigInt<unsigned_long_long,_256U> b_int;
  SizeT32 exponent_local;
  unsigned_long_long *number_local;
  
  b_int._36_4_ = exponent;
  BigInt<unsigned_long_long,_256U>::BigInt<unsigned_long_long>
            ((BigInt<unsigned_long_long,_256U> *)local_40,*number);
  exp = b_int._36_4_ + 0x40;
  BigInt<unsigned_long_long,_256U>::operator<<=((BigInt<unsigned_long_long,_256U> *)local_40,0x40);
  for (; 0x1a < (uint)b_int._36_4_; b_int._36_4_ = b_int._36_4_ + -0x1b) {
    SVar3 = DigitUtils::DigitConst<8U>::GetPowerOfOneOverFive(0x1b);
    BigInt<unsigned_long_long,_256U>::operator*=((BigInt<unsigned_long_long,_256U> *)local_40,SVar3)
    ;
    BigInt<unsigned_long_long,_256U>::operator>>=((BigInt<unsigned_long_long,_256U> *)local_40,0x40)
    ;
    SVar1 = DigitUtils::DigitConst<8U>::GetPowerOfOneOverFiveShift(0x1b);
    exp = SVar1 + exp;
  }
  if (b_int._36_4_ != 0) {
    SVar3 = DigitUtils::DigitConst<8U>::GetPowerOfOneOverFive(b_int._36_4_);
    BigInt<unsigned_long_long,_256U>::operator*=((BigInt<unsigned_long_long,_256U> *)local_40,SVar3)
    ;
    BigInt<unsigned_long_long,_256U>::operator>>=((BigInt<unsigned_long_long,_256U> *)local_40,0x40)
    ;
    SVar1 = DigitUtils::DigitConst<8U>::GetPowerOfOneOverFiveShift(b_int._36_4_);
    exp = SVar1 + exp;
  }
  SVar1 = BigInt<unsigned_long_long,_256U>::FindLastBit
                    ((BigInt<unsigned_long_long,_256U> *)local_40);
  BigInt<unsigned_long_long,_256U>::operator>>=
            ((BigInt<unsigned_long_long,_256U> *)local_40,SVar1 - 0x35);
  uVar4 = BigInt::operator_cast_to_unsigned_long_long((BigInt *)local_40);
  *number = uVar4;
  if (SVar1 < exp) {
    uVar2 = exp - SVar1;
    if (uVar2 < 0x3ff) {
      *number = (*number & 1) + *number;
      *number = *number >> 1;
      local_4c = (uint)(0x1fffffffffffff < *number) + (0x3ff - uVar2);
    }
    else {
      *number = *number >> ((char)uVar2 + 2U & 0x3f);
      *number = (*number & 1) + *number;
      *number = *number >> 1;
      local_4c = (uint)(0xfffffffffffff < *number);
    }
  }
  else {
    *number = (*number & 1) + *number;
    *number = *number >> 1;
    local_4c = (uint)(0x1fffffffffffff < *number) + (SVar1 - exp) + 0x3ff;
  }
  *number = *number & 0xfffffffffffff;
  *number = (ulong)local_4c << 0x34 | *number;
  return;
}

Assistant:

static void powerOfNegativeTen(Number_T &number, SizeT32 exponent) noexcept {
        using UNumber_T  = SizeT64;
        using DigitConst = DigitUtils::DigitConst<sizeof(UNumber_T)>;
        //////////////////////////////////////////////////////////////
        BigInt<UNumber_T, 256U> b_int{number};
        //////////////////////////////////////////////////////////////
        SizeT32 shifted{exponent};
        //////////////////////////////////////////////////////////////
        shifted += 64U;
        b_int <<= 64U;
        //////////////////////////////////////////////////////////////
        constexpr bool is_size_8 = (sizeof(UNumber_T) == 8U);
        if QENTEM_CONST_EXPRESSION (is_size_8) {
            while (exponent >= DigitConst::MaxPowerOfFive) {
                // 2**126 = 85070591730234615865843651857942052864
                // 5**27 = 7450580596923828125 (MaxPowerOfFive)
                // 2**126 / 5**27 = 11417981541647679048.4
                // 126-64=62; See 2**126 and 64 shift

                b_int *= DigitConst::GetPowerOfOneOverFive(DigitConst::MaxPowerOfFive);
                b_int >>= DigitConst::MaxShift;
                shifted += DigitConst::GetPowerOfOneOverFiveShift(DigitConst::MaxPowerOfFive);
                exponent -= DigitConst::MaxPowerOfFive;
            }

            if (exponent != 0) {
                b_int *= DigitConst::GetPowerOfOneOverFive(exponent);
                b_int >>= DigitConst::MaxShift;
                shifted += DigitConst::GetPowerOfOneOverFiveShift(exponent);
            }
        } else {
            while (exponent >= DigitConst::MaxPowerOfFive) {
                b_int <<= DigitConst::MaxShift;
                b_int /= DigitConst::GetPowerOfFive(DigitConst::MaxPowerOfFive);
                shifted += DigitConst::MaxShift;
                exponent -= DigitConst::MaxPowerOfFive;
            }

            if (exponent != 0) {
                b_int <<= DigitConst::MaxShift;
                b_int /= DigitConst::GetPowerOfFive(exponent);
                shifted += DigitConst::MaxShift;
            }
        }
        //////////////////////////////////////////////////////////////
        SizeT32       exp = DigitUtils::RealNumberInfo<double, 8U>::Bias; // double only
        const SizeT32 bit = b_int.FindLastBit();

        // if (bit <= 52U) {
        //     number = SizeT64(b_int);
        //     number <<= (53U - bit);
        // } else {
        b_int >>= (bit - SizeT32{53});
        number = SizeT64(b_int);
        // }
        //////////////////////////////////////////////////////////////
        if (shifted <= bit) {
            shifted = (bit - shifted);
            exp += shifted;

            number += (number & Number_T{1});
            number >>= 1U;
            exp += (number > Number_T{0x1FFFFFFFFFFFFF});
        } else {
            shifted -= bit;

            if (exp > shifted) {
                exp -= shifted;
                number += (number & Number_T{1});
                number >>= 1U;
                exp += (number > Number_T{0x1FFFFFFFFFFFFF});
            } else {
                shifted -= exp;
                ++shifted;
                number >>= shifted;
                number += (number & Number_T{1});
                number >>= 1U;
                exp = (number > Number_T{0xFFFFFFFFFFFFF});
            }
        }

        number &= 0xFFFFFFFFFFFFFULL;
        number |= (SizeT64(exp) << 52U);
    }